

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,BaseType *type)

{
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  BaseType *local_20;
  BaseType *type_local;
  KotlinKMPGenerator *this_local;
  
  local_20 = type;
  type_local = (BaseType *)this;
  this_local = (KotlinKMPGenerator *)__return_storage_ptr__;
  switch(*type) {
  case BASE_TYPE_NONE:
  case BASE_TYPE_UTYPE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UByte",&local_21);
    std::allocator<char>::~allocator(&local_21);
    break;
  case BASE_TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Boolean",local_35);
    std::allocator<char>::~allocator(local_35);
    break;
  case BASE_TYPE_CHAR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Byte",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case BASE_TYPE_UCHAR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UByte",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  case BASE_TYPE_SHORT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Short",&local_38);
    std::allocator<char>::~allocator(&local_38);
    break;
  case BASE_TYPE_USHORT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UShort",&local_39);
    std::allocator<char>::~allocator(&local_39);
    break;
  case BASE_TYPE_INT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int",&local_3a);
    std::allocator<char>::~allocator(&local_3a);
    break;
  case BASE_TYPE_UINT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UInt",&local_3b);
    std::allocator<char>::~allocator(&local_3b);
    break;
  case BASE_TYPE_LONG:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Long",&local_3c);
    std::allocator<char>::~allocator(&local_3c);
    break;
  case BASE_TYPE_ULONG:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ULong",&local_3d);
    std::allocator<char>::~allocator(&local_3d);
    break;
  case BASE_TYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Float",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    break;
  case BASE_TYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Double",&local_3f);
    std::allocator<char>::~allocator(&local_3f);
    break;
  case BASE_TYPE_STRING:
  case BASE_TYPE_STRUCT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Offset",&local_40);
    std::allocator<char>::~allocator(&local_40);
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_ARRAY:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"VectorOffset",&local_42);
    std::allocator<char>::~allocator(&local_42);
    break;
  case BASE_TYPE_UNION:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UnionOffset",&local_41);
    std::allocator<char>::~allocator(&local_41);
    break;
  case BASE_TYPE_VECTOR64:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp"
                  ,0xe2,
                  "std::string flatbuffers::kotlin::KotlinKMPGenerator::GenTypeBasic(const BaseType &) const"
                 );
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int",&local_43);
    std::allocator<char>::~allocator(&local_43);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const BaseType &type) const {
    switch (type) {
      case BASE_TYPE_NONE:
      case BASE_TYPE_UTYPE: return "UByte";
      case BASE_TYPE_BOOL: return "Boolean";
      case BASE_TYPE_CHAR: return "Byte";
      case BASE_TYPE_UCHAR: return "UByte";
      case BASE_TYPE_SHORT: return "Short";
      case BASE_TYPE_USHORT: return "UShort";
      case BASE_TYPE_INT: return "Int";
      case BASE_TYPE_UINT: return "UInt";
      case BASE_TYPE_LONG: return "Long";
      case BASE_TYPE_ULONG: return "ULong";
      case BASE_TYPE_FLOAT: return "Float";
      case BASE_TYPE_DOUBLE: return "Double";
      case BASE_TYPE_STRING:
      case BASE_TYPE_STRUCT: return "Offset";
      case BASE_TYPE_UNION: return "UnionOffset";
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_ARRAY: return "VectorOffset";
      // VECTOR64 not supported
      case BASE_TYPE_VECTOR64: FLATBUFFERS_ASSERT(0);
    }
    return "Int";
  }